

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_AActor_A_NoBlocking
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  AActor *self;
  bool bVar5;
  PClass *pPVar3;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_004b1ac8;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004b1ab8:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004b1ac8:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x47,
                  "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  self = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_004b1a7b;
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004b1ac8;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_004b1ab8;
LAB_004b1a7b:
    self = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_004b1a9b:
      A_Unblock(self,param[1].field_0.i != 0);
      return 0;
    }
    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_004b1a9b;
    pcVar4 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x48,
                "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_NoBlocking)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(drop);
	A_Unblock(self, drop);
	return 0;
}